

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cc
# Opt level: O0

int __thiscall
iqnet::Acceptor::accept(Acceptor *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  byte bVar1;
  int extraout_EAX;
  Inet_addr *pIVar2;
  char *data;
  size_t len;
  int __fd_00;
  undefined1 auVar4 [12];
  string local_68 [8];
  string msg;
  undefined1 local_38 [8];
  Socket new_sock;
  Acceptor *this_local;
  Firewall_base *pFVar3;
  
  new_sock.peer.impl_.pn.pi_ = (sp_counted_base *)this;
  Socket::accept((Socket *)local_38,(int)this + 8,__addr,__addr_len);
  if (this->firewall != (Firewall_base *)0x0) {
    pFVar3 = this->firewall;
    pIVar2 = Socket::get_peer_addr((Socket *)local_38);
    bVar1 = (**(code **)(*(long *)pFVar3 + 0x10))(pFVar3,pIVar2);
    if ((bVar1 & 1) == 0) {
      pFVar3 = this->firewall;
      (**(code **)(*(long *)pFVar3 + 0x18))(local_68);
      __fd_00 = (int)pFVar3;
      auVar4 = std::__cxx11::string::empty();
      if ((auVar4 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
        data = (char *)std::__cxx11::string::c_str();
        len = std::__cxx11::string::size();
        Socket::send_shutdown((Socket *)local_38,data,len);
      }
      else {
        Socket::shutdown((Socket *)local_38,__fd_00,auVar4._8_4_);
      }
      std::__cxx11::string::~string(local_68);
      goto LAB_001bf3a7;
    }
  }
  (*this->factory->_vptr_Accepted_conn_factory[2])(this->factory,local_38);
LAB_001bf3a7:
  Socket::~Socket((Socket *)local_38);
  return extraout_EAX;
}

Assistant:

void Acceptor::accept()
{
  Socket new_sock( sock.accept() );

  if( firewall && !firewall->grant( new_sock.get_peer_addr() ) )
  {
    std::string msg = firewall->message();

    if (!msg.empty())
    {
      new_sock.send_shutdown(msg.c_str(), msg.size());
    } else {
      new_sock.shutdown();
    }

    return;
  }

  factory->create_accepted( new_sock );
}